

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O0

FString M_ZLibError(int zerr)

{
  uint in_ESI;
  undefined4 in_register_0000003c;
  FString *this;
  int zerr_local;
  FString *out;
  
  this = (FString *)CONCAT44(in_register_0000003c,zerr);
  if ((int)in_ESI < 0) {
    if ((int)in_ESI < -6) {
      FString::FString(this);
      FString::Format(this,"%d",(ulong)in_ESI);
    }
    else {
      FString::FString(this,M_ZLibError::errs[(int)(-1 - in_ESI)]);
    }
  }
  else {
    FString::FString(this,"OK");
  }
  return (FString)(char *)this;
}

Assistant:

FString M_ZLibError(int zerr)
{
	if (zerr >= 0)
	{
		return "OK";
	}
	else if (zerr < -6)
	{
		FString out;
		out.Format("%d", zerr);
		return out;
	}
	else
	{
		static const char *errs[6] =
		{
			"Errno",
			"Stream Error",
			"Data Error",
			"Memory Error",
			"Buffer Error",
			"Version Error"
		};
		return errs[-zerr - 1];
	}
}